

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void show_battlefield_open
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                *battle_field)

{
  ostream *poVar1;
  undefined1 *puVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  allocator local_39;
  string local_38 [8];
  string coordinates;
  int local_18;
  int local_14;
  int j;
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  *battle_field_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"A0",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar1 = std::operator<<((ostream *)&std::cout,"  A B C D E F G H I J");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
    puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_38);
    *puVar2 = 0x41;
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_14);
    std::operator<<(poVar1,"|");
    for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
               ::operator[](battle_field,(key_type *)local_38);
      switch(*pmVar3) {
      case 0:
        std::operator<<((ostream *)&std::cout,' ');
        break;
      case 1:
        std::operator<<((ostream *)&std::cout,'*');
        break;
      case 2:
        std::operator<<((ostream *)&std::cout,'+');
        break;
      case 3:
        std::operator<<((ostream *)&std::cout,' ');
        break;
      case 4:
        std::operator<<((ostream *)&std::cout,'#');
        break;
      default:
        std::operator<<((ostream *)&std::cout,'&');
      }
      std::operator<<((ostream *)&std::cout," ");
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      *pcVar4 = *pcVar4 + '\x01';
    }
    std::operator<<((ostream *)&std::cout,"|");
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    *pcVar4 = *pcVar4 + '\x01';
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_battlefield_open (map <string, unsigned short> battle_field){
    int i=0, j=0;
    string coordinates="A0";
    cout<<"  A B C D E F G H I J"<<endl;
    cout<<"-----------------------"<<endl;
    for(i=0;i<10;i++){
        coordinates[0]='A';
        cout<<i<<"|";
        for(j=0;j<10;j++){
            switch (battle_field[coordinates]) {
                case 0:cout << ' ';break;
                case 1:cout << '*';break;
                case 2:cout << '+';break;
                case 3:cout << ' ';break;
                case 4:cout << '#';break;
                default: cout<<'&';
            }
            cout<<" ";
            coordinates[0]++;
        }
        cout<<"|";
        cout<<endl;
        coordinates[1]++;
    }
    cout<<"-----------------------"<<endl;
}